

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void ra_rename(ASMState *as,Reg down,Reg up)

{
  uint uVar1;
  IRIns *pIVar2;
  jit_State *pjVar3;
  byte bVar4;
  SnapNo SVar5;
  TRef TVar6;
  ulong uVar7;
  
  uVar1 = as->cost[down];
  as->cost[up] = uVar1;
  pIVar2 = as->ir;
  uVar7 = (ulong)((uVar1 & 0xffff) << 3);
  *(byte *)((long)pIVar2 + uVar7 + 6) = (byte)up;
  as->cost[down] = 0;
  as->modset = as->modset | 1 << ((byte)down & 0x1f);
  bVar4 = (byte)up & 0x1f;
  as->freeset = (as->freeset | 1 << (down & 0x1f)) & ~(1 << (up & 0x1f));
  as->weakset = as->weakset & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
  emit_movrr(as,(IRIns *)((long)pIVar2 + uVar7),down,up);
  if (*(char *)((long)as->ir + uVar7 + 7) == '\0') {
    pjVar3 = as->J;
    SVar5 = as->snapno;
    (pjVar3->fold).ins.field_0.ot = 0x1400;
    (pjVar3->fold).ins.field_0.op1 = (IRRef1)uVar1;
    (pjVar3->fold).ins.field_0.op2 = (IRRef1)SVar5;
    TVar6 = lj_ir_emit(as->J);
    pIVar2 = as->T->ir;
    as->ir = pIVar2;
    uVar7 = (ulong)((TVar6 & 0xffff) << 3);
    *(byte *)((long)pIVar2 + uVar7 + 6) = (byte)down;
    *(undefined1 *)((long)as->ir + uVar7 + 7) = 0;
  }
  return;
}

Assistant:

static void ra_rename(ASMState *as, Reg down, Reg up)
{
  IRRef ren, ref = regcost_ref(as->cost[up] = as->cost[down]);
  IRIns *ir = IR(ref);
  ir->r = (uint8_t)up;
  as->cost[down] = 0;
  lua_assert((down < RID_MAX_GPR) == (up < RID_MAX_GPR));
  lua_assert(!rset_test(as->freeset, down) && rset_test(as->freeset, up));
  ra_free(as, down);  /* 'down' is free ... */
  ra_modified(as, down);
  rset_clear(as->freeset, up);  /* ... and 'up' is now allocated. */
  ra_noweak(as, up);
  RA_DBGX((as, "rename    $f $r $r", regcost_ref(as->cost[up]), down, up));
  emit_movrr(as, ir, down, up);  /* Backwards codegen needs inverse move. */
  if (!ra_hasspill(IR(ref)->s)) {  /* Add the rename to the IR. */
    lj_ir_set(as->J, IRT(IR_RENAME, IRT_NIL), ref, as->snapno);
    ren = tref_ref(lj_ir_emit(as->J));
    as->ir = as->T->ir;  /* The IR may have been reallocated. */
    IR(ren)->r = (uint8_t)down;
    IR(ren)->s = SPS_NONE;
  }
}